

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::split_up
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str,char delimiter)

{
  char cVar1;
  pointer pcVar2;
  char *pcVar3;
  size_type sVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  long lVar6;
  long *plVar7;
  ulong uVar8;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  string value;
  string delims;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  value_type local_110;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_f0;
  long *local_e8;
  ulong local_e0;
  long local_d8 [2];
  long *local_c8 [2];
  long local_b8 [2];
  ulong local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  long *local_80;
  char *local_78;
  long local_70;
  long lStack_68;
  undefined1 *local_60;
  uint local_54;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_c8[0] = local_b8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"\'\"`","");
  local_e8 = (long *)(str->_M_dataplus)._M_p;
  local_110._M_dataplus._M_p = (pointer)((long)local_e8 + str->_M_string_length);
  ::std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
            (&local_60);
  str->_M_string_length = (long)local_60 - (long)(str->_M_dataplus)._M_p;
  *local_60 = 0;
  _Var5 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                    ();
  pcVar2 = (str->_M_dataplus)._M_p;
  if (pcVar2 + str->_M_string_length == _Var5._M_current) {
    str->_M_string_length = 0;
    *pcVar2 = '\0';
  }
  else {
    ::std::__cxx11::string::_M_erase((ulong)str,0);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (str->_M_string_length != 0) {
    local_a8 = 0;
    local_54 = (uint)(byte)delimiter;
    local_f0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__;
    do {
      paVar10 = &local_110.field_2;
      lVar6 = ::std::__cxx11::string::find
                        ((char)local_c8,(ulong)(uint)(int)*(str->_M_dataplus)._M_p);
      pcVar3 = (str->_M_dataplus)._M_p;
      if (lVar6 == -1) {
        _Var5 = ::std::
                __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::split_up(std::__cxx11::string,char)::_lambda(char)_1_>>
                          (pcVar3,pcVar3 + str->_M_string_length,local_54);
        pcVar2 = (str->_M_dataplus)._M_p;
        if (_Var5._M_current == pcVar2 + str->_M_string_length) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,str);
          ::std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,0x146053);
        }
        else {
          local_110._M_dataplus._M_p = (pointer)paVar10;
          ::std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((string *)&local_110,pcVar2,_Var5._M_current);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&local_110);
          local_e8 = local_d8;
          ::std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((string *)&local_e8,_Var5._M_current + 1,
                     (str->_M_dataplus)._M_p + str->_M_string_length);
          ::std::__cxx11::string::operator=((string *)str,(string *)&local_e8);
          if (local_e8 != local_d8) {
            operator_delete(local_e8,local_d8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        cVar1 = *pcVar3;
        lVar6 = ::std::__cxx11::string::find((char)str,(ulong)(uint)(int)cVar1);
        if (lVar6 == -1) {
LAB_0012e814:
          __return_storage_ptr__ =
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_f0;
          ::std::__cxx11::string::substr((ulong)&local_110,(ulong)str);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != paVar10) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,0x146053);
        }
        else {
          if ((str->_M_dataplus)._M_p[lVar6 + -1] == '\\') {
            do {
              lVar6 = ::std::__cxx11::string::find((char)str,(ulong)(uint)(int)cVar1);
              if (lVar6 == -1) {
                local_a8 = 0xffffffffffffff01;
                goto LAB_0012e814;
              }
              pcVar2 = (str->_M_dataplus)._M_p;
            } while (pcVar2[lVar6 + -1] == '\\');
            local_a8 = CONCAT71((int7)((ulong)pcVar2 >> 8),1);
          }
          __return_storage_ptr__ =
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_f0;
          ::std::__cxx11::string::substr((ulong)&local_110,(ulong)str);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != paVar10) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::string::substr((ulong)&local_110,(ulong)str);
          ::std::__cxx11::string::operator=((string *)str,(string *)&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != paVar10) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if ((local_a8 & 1) != 0) {
        pcVar2 = (*(pointer *)((long)__return_storage_ptr__ + 8))[-1]._M_dataplus._M_p;
        local_a0 = &local_90;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,pcVar2,
                   pcVar2 + (*(pointer *)((long)__return_storage_ptr__ + 8))[-1]._M_string_length);
        local_e8 = local_d8;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"\\","");
        plVar7 = (long *)::std::__cxx11::string::_M_replace_aux((ulong)&local_e8,local_e0,0,'\x01');
        local_80 = &local_70;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_70 = *plVar9;
          lStack_68 = plVar7[3];
        }
        else {
          local_70 = *plVar9;
          local_80 = (long *)*plVar7;
        }
        local_78 = (char *)plVar7[1];
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        local_50 = local_40;
        ::std::__cxx11::string::_M_construct((ulong)&local_50,'\x01');
        uVar8 = ::std::__cxx11::string::find((char *)&local_a0,(ulong)local_80,0);
        sVar4 = local_98;
        while (uVar8 != 0xffffffffffffffff) {
          local_98 = sVar4;
          ::std::__cxx11::string::replace((ulong)&local_a0,uVar8,local_78,(ulong)local_50);
          uVar8 = ::std::__cxx11::string::find((char *)&local_a0,(ulong)local_80,uVar8 + local_48);
          sVar4 = local_98;
        }
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        if (local_a0 != &local_90) {
          local_110._M_dataplus._M_p = (pointer)local_a0;
        }
        local_110.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
        local_110.field_2._M_local_buf[0] = local_90._M_local_buf[0];
        local_98 = 0;
        local_90._M_local_buf[0] = '\0';
        local_110._M_string_length = sVar4;
        local_a0 = &local_90;
        ::std::__cxx11::string::operator=
                  ((string *)(*(pointer *)((long)__return_storage_ptr__ + 8) + -1),
                   (string *)&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        if (local_80 != &local_70) {
          operator_delete(local_80,local_70 + 1);
        }
        if (local_e8 != local_d8) {
          operator_delete(local_e8,local_d8[0] + 1);
        }
        if (local_a0 != &local_90) {
          operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,
                                            local_90._M_local_buf[0]) + 1);
        }
        local_a8 = 0;
      }
      local_e8 = (long *)(str->_M_dataplus)._M_p;
      local_110._M_dataplus._M_p = (pointer)((long)local_e8 + str->_M_string_length);
      ::std::
      __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                (&local_60,&local_110,&local_e8);
      str->_M_string_length = (long)local_60 - (long)(str->_M_dataplus)._M_p;
      *local_60 = 0;
      _Var5 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                        ();
      pcVar2 = (str->_M_dataplus)._M_p;
      if (pcVar2 + str->_M_string_length == _Var5._M_current) {
        str->_M_string_length = 0;
        *pcVar2 = '\0';
      }
      else {
        ::std::__cxx11::string::_M_erase((ulong)str,0);
      }
    } while (str->_M_string_length != 0);
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
            __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> split_up(std::string str, char delimiter = '\0') {

    const std::string delims("\'\"`");
    auto find_ws = [delimiter](char ch) {
        return (delimiter == '\0') ? (std::isspace<char>(ch, std::locale()) != 0) : (ch == delimiter);
    };
    trim(str);

    std::vector<std::string> output;
    bool embeddedQuote = false;
    char keyChar = ' ';
    while(!str.empty()) {
        if(delims.find_first_of(str[0]) != std::string::npos) {
            keyChar = str[0];
            auto end = str.find_first_of(keyChar, 1);
            while((end != std::string::npos) && (str[end - 1] == '\\')) {  // deal with escaped quotes
                end = str.find_first_of(keyChar, end + 1);
                embeddedQuote = true;
            }
            if(end != std::string::npos) {
                output.push_back(str.substr(1, end - 1));
                str = str.substr(end + 1);
            } else {
                output.push_back(str.substr(1));
                str = "";
            }
        } else {
            auto it = std::find_if(std::begin(str), std::end(str), find_ws);
            if(it != std::end(str)) {
                std::string value = std::string(str.begin(), it);
                output.push_back(value);
                str = std::string(it + 1, str.end());
            } else {
                output.push_back(str);
                str = "";
            }
        }
        // transform any embedded quotes into the regular character
        if(embeddedQuote) {
            output.back() = find_and_replace(output.back(), std::string("\\") + keyChar, std::string(1, keyChar));
            embeddedQuote = false;
        }
        trim(str);
    }
    return output;
}